

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim.c
# Opt level: O0

object * do_Integer(int op,object *low,object *high)

{
  uintptr_t uVar1;
  uintptr_t uVar2;
  object *local_58;
  object *local_50;
  int64_t *tmp;
  int64_t h;
  int64_t l;
  object *high_local;
  object *low_local;
  object *poStack_10;
  int op_local;
  
  uVar1 = low[1].header;
  uVar2 = high[1].header;
  switch(op) {
  case 0x19:
    if (uVar2 == 0) {
      poStack_10 = (object *)0x0;
    }
    else {
      poStack_10 = newLInteger((long)uVar1 / (long)uVar2);
    }
    break;
  case 0x1a:
    if (uVar2 == 0) {
      poStack_10 = (object *)0x0;
    }
    else {
      poStack_10 = newLInteger((long)uVar1 % (long)uVar2);
    }
    break;
  case 0x1b:
    poStack_10 = newLInteger(uVar1 + uVar2);
    break;
  case 0x1c:
    poStack_10 = newLInteger(uVar1 * uVar2);
    break;
  case 0x1d:
    poStack_10 = newLInteger(uVar1 - uVar2);
    break;
  case 0x1e:
    if ((long)uVar1 < (long)uVar2) {
      local_50 = trueObject;
    }
    else {
      local_50 = falseObject;
    }
    poStack_10 = local_50;
    break;
  case 0x1f:
    if (uVar1 == uVar2) {
      local_58 = trueObject;
    }
    else {
      local_58 = falseObject;
    }
    poStack_10 = local_58;
    break;
  default:
    error_impl("do_Integer",0x2a0,"do_Integer(): Invalid primitive integer operation %d!",
               (ulong)(uint)op);
    poStack_10 = (object *)0x0;
  }
  return poStack_10;
}

Assistant:

struct object *do_Integer(int op, struct object *low, struct object *high)
{
    int64_t l, h;
    int64_t *tmp;

    tmp = (int64_t *)bytePtr(low);
    l = *tmp;
    tmp = (int64_t *)bytePtr(high);
    h = *tmp;
    switch (op) {
    case 25:    /* Integer division */
        if (h == 0LL) {
            return(NULL);
        }
        return(newLInteger(l/h));

    case 26:    /* Integer remainder */
        if (h == 0LL) {
            return(NULL);
        }
        return(newLInteger(l%h));

    case 27:    /* Integer addition */
        return(newLInteger(l+h));

    case 28:    /* Integer multiplication */
        return(newLInteger(l*h));

    case 29:    /* Integer subtraction */
        return(newLInteger(l-h));

    case 30:    /* Integer less than */
        return((l < h) ? trueObject : falseObject);

    case 31:    /* Integer equality */
        return((l == h) ? trueObject : falseObject);

    default:
        error("do_Integer(): Invalid primitive integer operation %d!", op);
    }
    return(NULL);
}